

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfInputFile.cpp
# Opt level: O2

void __thiscall Imf_3_4::InputFile::InputFile(InputFile *this,InputPartData *part)

{
  InputFile *local_18;
  
  std::__shared_ptr<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2> *)this,
             (__shared_ptr<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2> *)&part->context);
  local_18 = this;
  std::make_shared<Imf_3_4::InputFile::Data,Imf_3_4::Context*,int&>
            ((Context **)&this->_data,(int *)&local_18);
  ((this->_data).super___shared_ptr<Imf_3_4::InputFile::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
  _part = part;
  initialize(this);
  return;
}

Assistant:

InputFile::InputFile (InputPartData* part)
    : _ctxt (part->context),
      _data (std::make_shared<Data> (&_ctxt, part->numThreads))
{
    _data->_part = part;
    initialize ();
}